

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

iterator * __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::find<int>(iterator *__return_storage_ptr__,
           dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *this,int *key)

{
  size_type sVar1;
  pointer ppVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  
  if (this->num_elements != this->num_deleted) {
    pVar3 = find_position<int>(this,key);
    if (pVar3.first != 0xffffffffffffffff) {
      sVar1 = this->num_buckets;
      ppVar2 = this->table;
      __return_storage_ptr__->ht = this;
      __return_storage_ptr__->pos = ppVar2 + pVar3.first;
      __return_storage_ptr__->end = ppVar2 + sVar1;
      return __return_storage_ptr__;
    }
  }
  sVar1 = this->num_buckets;
  ppVar2 = this->table;
  __return_storage_ptr__->ht = this;
  __return_storage_ptr__->pos = ppVar2 + sVar1;
  __return_storage_ptr__->end = ppVar2 + sVar1;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::advance_past_empty_and_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table + pos.first, table + num_buckets, false);
  }